

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O3

void __thiscall sjtu::UserManager::modify_profile(UserManager *this,int argc,string *argv)

{
  string *psVar1;
  uint uVar2;
  uint uVar3;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar4;
  int iVar5;
  int *piVar6;
  undefined4 extraout_var;
  char *pcVar7;
  size_t sVar8;
  long *plVar9;
  undefined8 uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  string *psVar14;
  long lVar15;
  string *psVar16;
  bool bVar17;
  pair<long,_bool> pVar18;
  string curname;
  string usname;
  string umail;
  string uname;
  string uspass;
  long local_158;
  char *local_138;
  char local_130;
  undefined1 *local_128;
  size_t local_120;
  undefined1 local_118;
  undefined7 uStack_117;
  undefined1 *local_108;
  size_t local_100;
  undefined1 local_f8;
  undefined7 uStack_f7;
  long *local_e8 [2];
  long local_d8 [2];
  long *local_c8 [2];
  long local_b8 [2];
  long *local_a8 [2];
  long local_98 [2];
  ulong local_88;
  char local_80;
  long *local_78;
  long local_70;
  long local_68 [2];
  long *local_58;
  long local_50;
  long local_48 [2];
  ulong local_38;
  undefined4 extraout_var_00;
  
  local_108 = &local_f8;
  local_100 = 0;
  local_f8 = 0;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"");
  local_128 = &local_118;
  local_120 = 0;
  local_118 = 0;
  iVar12 = 0;
  if (argc < 1) {
    local_158._0_4_ = -1;
  }
  else {
    psVar16 = argv + 1;
    local_158 = 0xffffffff;
    do {
      psVar1 = psVar16 + -1;
      iVar5 = std::__cxx11::string::compare((char *)psVar1);
      psVar14 = (string *)&local_108;
      if (iVar5 == 0) {
LAB_001065a0:
        std::__cxx11::string::_M_assign(psVar14);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)psVar1);
        psVar14 = (string *)local_a8;
        if (iVar5 == 0) goto LAB_001065a0;
        iVar5 = std::__cxx11::string::compare((char *)psVar1);
        psVar14 = (string *)local_c8;
        if (iVar5 == 0) goto LAB_001065a0;
        iVar5 = std::__cxx11::string::compare((char *)psVar1);
        psVar14 = (string *)local_e8;
        if (iVar5 == 0) goto LAB_001065a0;
        iVar5 = std::__cxx11::string::compare((char *)psVar1);
        psVar14 = (string *)&local_128;
        if (iVar5 == 0) goto LAB_001065a0;
        iVar5 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar5 == 0) {
          pcVar7 = (psVar16->_M_dataplus)._M_p;
          piVar6 = __errno_location();
          iVar5 = *piVar6;
          *piVar6 = 0;
          local_158 = strtol(pcVar7,&local_138,10);
          if (local_138 == pcVar7) {
LAB_00106b14:
            uVar10 = std::__throw_invalid_argument("stoi");
            if (local_128 != &local_118) {
              operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
            }
            if (local_e8[0] != local_d8) {
              operator_delete(local_e8[0],local_d8[0] + 1);
            }
            if (local_c8[0] != local_b8) {
              operator_delete(local_c8[0],local_b8[0] + 1);
            }
            if (local_a8[0] != local_98) {
              operator_delete(local_a8[0],local_98[0] + 1);
            }
            if (local_108 != &local_f8) {
              operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
            }
            _Unwind_Resume(uVar10);
          }
          if (((int)local_158 != local_158) || (*piVar6 == 0x22)) {
            std::__throw_out_of_range("stoi");
            goto LAB_00106b14;
          }
          if (*piVar6 == 0) {
            *piVar6 = iVar5;
          }
        }
      }
      psVar16 = psVar16 + 2;
      iVar12 = iVar12 + 2;
    } while (iVar12 < argc);
  }
  pBVar4 = this->UserBpTree;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_128,local_128 + local_120);
  if (local_50 == 0) {
    local_88 = 0;
  }
  else {
    lVar15 = 0;
    lVar11 = 0;
    uVar13 = 0;
    do {
      lVar11 = ((long)*(char *)((long)local_58 + lVar15) + lVar11 * 0x239 + 0x100) % 0x3b800001;
      uVar13 = (long)((long)*(char *)((long)local_58 + lVar15) + uVar13 * 0x301 + 0x100) %
               0x3b9aca07;
      lVar15 = lVar15 + 1;
    } while (local_50 != lVar15);
    local_88 = lVar11 << 0x20 | uVar13;
  }
  pVar18 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (pBVar4,&local_88);
  local_138 = (char *)pVar18.first;
  local_130 = pVar18.second;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  pBVar4 = this->UserBpTree;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_108,local_108 + local_100);
  if (local_70 == 0) {
    local_38 = 0;
  }
  else {
    lVar15 = 0;
    lVar11 = 0;
    local_38 = 0;
    do {
      lVar11 = ((long)*(char *)((long)local_78 + lVar15) + lVar11 * 0x239 + 0x100) % 0x3b800001;
      local_38 = (long)((long)*(char *)((long)local_78 + lVar15) + local_38 * 0x301 + 0x100) %
                 0x3b9aca07;
      lVar15 = lVar15 + 1;
    } while (local_70 != lVar15);
    local_38 = lVar11 << 0x20 | local_38;
  }
  pVar18 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (pBVar4,&local_38);
  local_88 = pVar18.first;
  local_80 = pVar18.second;
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if ((local_130 != '\x01') || (local_80 != '\x01')) {
    plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    goto LAB_00106a52;
  }
  iVar5 = (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                    (this->UserFile,&local_138);
  iVar12 = *(int *)(CONCAT44(extraout_var,iVar5) + 0x68);
  uVar2 = *(uint *)(CONCAT44(extraout_var,iVar5) + 0x6c);
  uVar3 = this->online_flag;
  bVar17 = uVar2 == uVar3;
  iVar5 = (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                    (this->UserFile,&local_88);
  pcVar7 = (char *)CONCAT44(extraout_var_00,iVar5);
  if (*(int *)(pcVar7 + 0x68) < iVar12) {
    if (uVar2 != uVar3) goto LAB_00106a17;
LAB_001068ae:
    if (iVar12 <= (int)local_158) goto LAB_00106a17;
    iVar12 = std::__cxx11::string::compare((char *)local_a8);
    if (iVar12 != 0) {
      strcpy(pcVar7 + 0x15,(char *)local_a8[0]);
    }
    iVar12 = std::__cxx11::string::compare((char *)local_c8);
    if (iVar12 != 0) {
      strcpy(pcVar7 + 0x34,(char *)local_c8[0]);
    }
    iVar12 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar12 != 0) {
      strcpy(pcVar7 + 0x49,(char *)local_e8[0]);
    }
    if ((int)local_158 != -1) {
      *(int *)(pcVar7 + 0x68) = (int)local_158;
    }
    (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[3])
              (this->UserFile,pcVar7 + 0x78);
    sVar8 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,sVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    sVar8 = strlen(pcVar7 + 0x34);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7 + 0x34,sVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    sVar8 = strlen(pcVar7 + 0x49);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7 + 0x49,sVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,*(int *)(pcVar7 + 0x68));
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
  }
  else {
    if (local_120 == local_100) {
      if (local_120 != 0) {
        iVar5 = bcmp(local_128,local_108,local_120);
        bVar17 = iVar5 == 0 && uVar2 == uVar3;
      }
      if (bVar17) goto LAB_001068ae;
    }
LAB_00106a17:
    plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
  }
  std::ostream::put((char)plVar9);
  std::ostream::flush();
LAB_00106a52:
  if (local_128 != &local_118) {
    operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
  }
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
  }
  return;
}

Assistant:

void modify_profile(int argc, std::string *argv) {
            std::string usname, uspass = "", uname = "", umail = "", curname;
            int upri = -1;
            for (int i = 0; i < argc; i += 2) {
                if (argv[i] == "-u") usname = argv[i + 1];
                else if (argv[i] == "-p") uspass = argv[i + 1];
                else if (argv[i] == "-n") uname = argv[i + 1];
                else if (argv[i] == "-m") umail = argv[i + 1];
                else if (argv[i] == "-c") curname = argv[i + 1];
                else if (argv[i] == "-g") upri = stoi(argv[i + 1]);
            }
            std::pair<locType, bool> tmp1 = UserBpTree->find(hasher(curname));
            std::pair<locType, bool> tmp2 = UserBpTree->find(hasher(usname));
            if (tmp1.second == true && tmp2.second == true) {
                userType *cur = UserFile->read(tmp1.first);
                int cur_privilege = cur->privilege;
                bool cur_is_online = cur->is_online == online_flag;
                userType *user = UserFile->read(tmp2.first);
                if ((cur_privilege > user->privilege || curname == usname) && cur_is_online == true &&
                    cur_privilege > upri) {
                    if (uspass != "") strcpy(user->password, uspass.c_str());
                    if (uname != "") strcpy(user->name, uname.c_str());;
                    if (umail != "") strcpy(user->mailAddr, umail.c_str());;
                    if (upri != -1) user->privilege = upri;
                    UserFile->save(user->offset);
                    std::cout << user->username << " " << user->name << " " << user->mailAddr << " " << user->privilege
                              << std::endl;
                } else std::cout << -1 << std::endl;
            } else std::cout << -1 << std::endl;
        }